

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

void duckdb::ListFinalize
               (Vector *states_vector,AggregateInputData *aggr_input_data,Vector *result,idx_t count
               ,idx_t offset)

{
  long lVar1;
  long *plVar2;
  Vector *pVVar3;
  ulong uVar4;
  FunctionData *pFVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long *plVar9;
  UnifiedVectorFormat states_data;
  long *local_78;
  long local_70;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)states_vector,(UnifiedVectorFormat *)count);
  FlatVector::VerifyFlatVector(result);
  lVar1 = *(long *)(result + 0x20);
  uVar4 = duckdb::ListVector::GetListSize(result);
  pFVar5 = optional_ptr<duckdb::FunctionData,_true>::operator->(&aggr_input_data->bind_data);
  plVar9 = (long *)(offset * 0x10 + lVar1 + 8);
  for (uVar7 = 0; count != uVar7; uVar7 = uVar7 + 1) {
    uVar8 = uVar7;
    if (*local_78 != 0) {
      uVar8 = (ulong)*(uint *)(*local_78 + uVar7 * 4);
    }
    plVar2 = *(long **)(local_70 + uVar8 * 8);
    plVar9[-1] = uVar4;
    lVar1 = *plVar2;
    if (lVar1 == 0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),offset + uVar7);
      *plVar9 = 0;
    }
    else {
      *plVar9 = lVar1;
      uVar4 = uVar4 + lVar1;
    }
    plVar9 = plVar9 + 2;
  }
  duckdb::ListVector::Reserve(result,uVar4);
  uVar7 = duckdb::ListVector::GetEntry(result);
  for (uVar8 = 0; count != uVar8; uVar8 = uVar8 + 1) {
    uVar6 = uVar8;
    if (*local_78 != 0) {
      uVar6 = (ulong)*(uint *)(*local_78 + uVar8 * 4);
    }
    pVVar3 = *(Vector **)(local_70 + uVar6 * 8);
    if (*(long *)pVVar3 != 0) {
      duckdb::ListSegmentFunctions::BuildListVector((LinkedList *)(pFVar5 + 0x20),pVVar3,uVar7);
    }
  }
  duckdb::ListVector::SetListSize(result,uVar4);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  return;
}

Assistant:

static void ListFinalize(Vector &states_vector, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
                         idx_t offset) {

	UnifiedVectorFormat states_data;
	states_vector.ToUnifiedFormat(count, states_data);
	auto states = UnifiedVectorFormat::GetData<ListAggState *>(states_data);

	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);

	auto &mask = FlatVector::Validity(result);
	auto result_data = FlatVector::GetData<list_entry_t>(result);
	size_t total_len = ListVector::GetListSize(result);

	auto &list_bind_data = aggr_input_data.bind_data->Cast<ListBindData>();

	// first iterate over all entries and set up the list entries, and get the newly required total length
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[states_data.sel->get_index(i)];
		const auto rid = i + offset;
		result_data[rid].offset = total_len;
		if (state.linked_list.total_capacity == 0) {
			mask.SetInvalid(rid);
			result_data[rid].length = 0;
			continue;
		}

		// set the length and offset of this list in the result vector
		auto total_capacity = state.linked_list.total_capacity;
		result_data[rid].length = total_capacity;
		total_len += total_capacity;
	}

	// reserve capacity, then iterate over all entries again and copy over the data to the child vector
	ListVector::Reserve(result, total_len);
	auto &result_child = ListVector::GetEntry(result);
	for (idx_t i = 0; i < count; i++) {

		auto &state = *states[states_data.sel->get_index(i)];
		const auto rid = i + offset;
		if (state.linked_list.total_capacity == 0) {
			continue;
		}

		idx_t current_offset = result_data[rid].offset;
		list_bind_data.functions.BuildListVector(state.linked_list, result_child, current_offset);
	}

	ListVector::SetListSize(result, total_len);
}